

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffmrky(fitsfile *fptr,int nmove,int *status)

{
  FITSfile *pFVar1;
  
  pFVar1 = fptr->Fptr;
  if (fptr->HDUposition != pFVar1->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar1 = fptr->Fptr;
  }
  pFVar1->nextkey = pFVar1->nextkey + (long)(nmove * 0x50);
  return *status;
}

Assistant:

int ffmrky(fitsfile *fptr,    /* I - FITS file pointer                   */
          int nmove,          /* I - relative number of keywords to move */
          int *status)        /* IO - error status                       */
{
/*
  move pointer to the specified keyword position relative to the current
  position.  E.g. this keyword  will then be read by the next call to ffgnky.
*/

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->nextkey += (nmove * 80);

    return(*status);
}